

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_fixed_suite::fixed_size(void)

{
  uint uVar1;
  size_type sVar2;
  initializer_list<int> input;
  circular_view<int,_4UL> span;
  int array [4];
  undefined4 local_74;
  size_type local_70 [2];
  circular_view<int,_4UL> local_60;
  type local_48 [6];
  
  local_60.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_60.member.size = 0;
  local_60.member.next = 4;
  local_70[0] = 0;
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x351,"void api_fixed_suite::fixed_size()",local_70,&local_74);
  local_70[0] = 0x160000000b;
  local_70[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_70;
  vista::circular_view<int,_4UL>::assign(&local_60,input);
  local_70[0] = local_60.member.size;
  local_74 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x353,"void api_fixed_suite::fixed_size()",local_70,&local_74);
  uVar1 = (uint)local_60.member.next;
  local_60.member.next = (ulong)(uVar1 + 1 & 3) | 4;
  sVar2 = local_60.member.size + 1;
  if (local_60.member.size == 4) {
    sVar2 = 4;
  }
  local_60.member.size = sVar2;
  if (sVar2 != 0) {
    local_60.member.data[uVar1 & 3] = 0x37;
    local_74 = 4;
    local_70[0] = sVar2;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
              ("span.size()","4",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
               ,0x355,"void api_fixed_suite::fixed_size()",local_70,&local_74);
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x80,"reference vista::circular_view<int, 4>::back() [T = int, Extent = 4]");
}

Assistant:

void fixed_size()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}